

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_signature.hpp
# Opt level: O0

void chaiscript::dispatch::detail::
     function_signature<std::__cxx11::string_const_chaiscript::AST_Node::*>
               (offset_in_AST_Node_to_unknown *f)

{
  offset_in_AST_Node_to_unknown *f_local;
  
  Function_Signature<std::__cxx11::string_const,chaiscript::dispatch::detail::Function_Params<chaiscript::AST_Node&>,true,true,true,false>
  ::Function_Signature<std::__cxx11::string_const_chaiscript::AST_Node::*const&>
            ((Function_Signature<std::__cxx11::string_const,chaiscript::dispatch::detail::Function_Params<chaiscript::AST_Node&>,true,true,true,false>
              *)((long)&f_local + 7),f);
  return;
}

Assistant:

auto function_signature(const Func &f) {
    if constexpr (has_call_operator<Func>::value) {
      return Function_Signature<typename decltype(Function_Signature{&std::decay_t<Func>::operator()})::Return_Type,
                                typename decltype(Function_Signature{&std::decay_t<Func>::operator()})::Param_Types,
                                decltype(Function_Signature{&std::decay_t<Func>::operator()})::is_noexcept,
                                false,
                                false,
                                true>{};
    } else {
      return Function_Signature{f};
    }
  }